

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::ParseableFunctionInfo::CleanupToReparse(ParseableFunctionInfo *this)

{
  undefined1 *puVar1;
  NestedArray *pNVar2;
  FunctionProxy *this_00;
  bool bVar3;
  FunctionBody *pFVar4;
  ParseableFunctionInfo *this_01;
  uint i;
  ulong uVar5;
  
  bVar3 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (bVar3) {
    pFVar4 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    puVar1 = &(pFVar4->counters).field_0x1;
    *puVar1 = *puVar1 & 0xfe;
  }
  pNVar2 = (this->nestedArray).ptr;
  if (pNVar2 != (NestedArray *)0x0) {
    for (uVar5 = 0; uVar5 < pNVar2->nestedCount; uVar5 = uVar5 + 1) {
      this_00 = *(FunctionProxy **)((long)pNVar2[uVar5 + 1] + 8);
      if (this_00 != (FunctionProxy *)0x0) {
        bVar3 = FunctionProxy::CanBeDeferred(this_00);
        if ((!bVar3) || (((this_00->functionInfo).ptr)->compileCount == 0)) {
          bVar3 = FunctionProxy::IsFunctionBody(this_00);
          if (!bVar3) goto LAB_006caabf;
        }
        this_01 = FunctionProxy::GetParseableFunctionInfo(this_00);
        CleanupToReparse(this_01);
      }
LAB_006caabf:
    }
  }
  CleanupToReparseHelper(this);
  bVar3 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (bVar3) {
    pFVar4 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    FunctionBody::CleanupToReparseHelper(pFVar4);
    return;
  }
  return;
}

Assistant:

void ParseableFunctionInfo::CleanupToReparse()
    {
#if DBG
        if (this->IsFunctionBody())
        {
            GetFunctionBody()->UnlockCounters();
        }
#endif
        // The current function is already compiled. In order to prep this function to ready for debug mode, most of the previous information need to be thrown away.
        // Clean up the nested functions
        this->ForEachNestedFunc([&](FunctionProxy* proxy, uint32 index)
        {
            // Note: redeferred functions may have fully compiled children. If we find a redeferred function, keep walking.
            if (proxy && ((proxy->CanBeDeferred() && proxy->GetFunctionInfo()->GetCompileCount() > 0) || proxy->IsFunctionBody()))
            {
                proxy->GetParseableFunctionInfo()->CleanupToReparse();
            }
            return true;
        });

        this->CleanupToReparseHelper();
        if (this->IsFunctionBody())
        {
            this->GetFunctionBody()->CleanupToReparseHelper();
        }
    }